

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::move
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  buffer<char> *buf_data;
  size_t sVar1;
  size_t buf_capacity;
  buffer<char> *in_RSI;
  buffer<char> *in_RDI;
  size_t capacity;
  size_t size;
  char *data;
  size_t in_stack_ffffffffffffffb8;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *__last;
  
  buf_data = (buffer<char> *)detail::buffer<char>::data(in_RSI);
  sVar1 = detail::buffer<char>::size(in_RSI);
  buf_capacity = detail::buffer<char>::capacity(in_RSI);
  if (buf_data == in_RSI + 1) {
    detail::buffer<char>::set(in_RDI,(char *)(in_RDI + 1),buf_capacity);
    in_stack_ffffffffffffffc0 =
         (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)(in_RSI + 1);
    __last = (char *)((long)&in_RSI[1]._vptr_buffer + sVar1);
    detail::make_checked<char>((char *)(in_RDI + 1),buf_capacity);
    std::uninitialized_copy<char*,char*>((char *)in_RDI,__last,(char *)in_stack_ffffffffffffffc0);
  }
  else {
    detail::buffer<char>::set(in_RDI,(char *)buf_data,buf_capacity);
    detail::buffer<char>::set(in_RSI,(char *)(in_RSI + 1),0);
  }
  resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              detail::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }